

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O3

void write_mods(ang_file *fff,int *values)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  char buf [1024];
  char local_438 [1032];
  
  memset(local_438,0,0x400);
  iVar3 = 0;
  lVar4 = 0;
LAB_00136d92:
  do {
    if (values[lVar4] != 0) {
      if (local_438[0] != '\0') {
        my_strcat(local_438," | ",0x400);
        iVar3 = iVar3 + 3;
      }
      pcVar2 = write_mods::obj_mods[lVar4];
      my_strcat(local_438,pcVar2,0x400);
      sVar1 = strlen(pcVar2);
      pcVar2 = format("[%d]",(ulong)(uint)values[lVar4]);
      my_strcat(local_438,pcVar2,0x400);
      if (0x36 < iVar3 + (int)sVar1) {
        iVar3 = 0;
        file_putf(fff,"%s%s\n","values:",local_438);
        my_strcpy(local_438,"",0x400);
        lVar4 = lVar4 + 1;
        if (lVar4 == 0x10) {
          return;
        }
        goto LAB_00136d92;
      }
      iVar3 = iVar3 + (int)sVar1 + 5;
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x10) {
      if (iVar3 == 0) {
        return;
      }
      file_putf(fff,"%s%s\n","values:",local_438);
      return;
    }
  } while( true );
}

Assistant:

void write_mods(ang_file *fff, const int values[])
{
	size_t i;
	char buf[1024] = "";
	int pointer = 0;

	static const char *obj_mods[] = {
		#define STAT(a) #a,
		#include "list-stats.h"
		#undef STAT
		#define OBJ_MOD(a) #a,
		#include "list-object-modifiers.h"
		#undef OBJ_MOD
		NULL
	};

	/* Write value list */
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		/* If no value, don't write */
		if (values[i] == 0) continue;

		/* If this line contains something, write a divider */
		if (strlen(buf)) {
			my_strcat(buf, " | ", sizeof(buf));
			pointer += 3;
		}

		/* Write the name and value */
		my_strcat(buf, obj_mods[i], sizeof(buf));
		pointer += strlen(obj_mods[i]);
		my_strcat(buf, format("[%d]", values[i]), sizeof(buf));
		pointer += 5;

		/* Move to a new line if this one is long enough */
		if (pointer >= 60) {
			file_putf(fff, "%s%s\n", "values:", buf);
			my_strcpy(buf, "", sizeof(buf));
			pointer = 0;
		}
	}

	/* Print remaining values if any */
	if (pointer)
		file_putf(fff, "%s%s\n", "values:", buf);
}